

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_text_colored(nk_context *ctx,char *str,int len,nk_flags alignment,nk_color color)

{
  nk_window *pnVar1;
  nk_vec2 nVar2;
  undefined1 local_60 [8];
  nk_text text;
  nk_rect bounds;
  nk_vec2 item_padding;
  nk_style *style;
  nk_window *win;
  nk_flags alignment_local;
  int len_local;
  char *str_local;
  nk_context *ctx_local;
  nk_color color_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4fc1,
                  "void nk_text_colored(struct nk_context *, const char *, int, nk_flags, struct nk_color)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4fc2,
                  "void nk_text_colored(struct nk_context *, const char *, int, nk_flags, struct nk_color)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4fc3,
                  "void nk_text_colored(struct nk_context *, const char *, int, nk_flags, struct nk_color)"
                 );
  }
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    pnVar1 = ctx->current;
    nk_panel_alloc_space((nk_rect *)&text.background,ctx);
    nVar2 = (ctx->style).text.padding;
    bounds.w = nVar2.x;
    local_60._0_4_ = bounds.w;
    bounds.h = nVar2.y;
    local_60._4_4_ = bounds.h;
    text.padding.x = *(float *)&(ctx->style).window.background;
    text.padding.y = (float)color;
    nk_widget_text(&pnVar1->buffer,stack0xffffffffffffffb0,str,len,(nk_text *)local_60,alignment,
                   (ctx->style).font);
  }
  return;
}

Assistant:

NK_API void
nk_text_colored(struct nk_context *ctx, const char *str, int len,
    nk_flags alignment, struct nk_color color)
{
    struct nk_window *win;
    const struct nk_style *style;

    struct nk_vec2 item_padding;
    struct nk_rect bounds;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout) return;

    win = ctx->current;
    style = &ctx->style;
    nk_panel_alloc_space(&bounds, ctx);
    item_padding = style->text.padding;

    text.padding.x = item_padding.x;
    text.padding.y = item_padding.y;
    text.background = style->window.background;
    text.text = color;
    nk_widget_text(&win->buffer, bounds, str, len, &text, alignment, style->font);
}